

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

void * stb_leakcheck_malloc(size_t sz,char *file,char *func,int line)

{
  bool bVar1;
  sx_lock_t sVar2;
  stb__leakcheck_malloc_info *dst;
  int _i_125;
  stb__leakcheck_malloc_info *mi;
  int line_local;
  char *func_local;
  char *file_local;
  size_t sz_local;
  
  dst = (stb__leakcheck_malloc_info *)malloc(sz + 0xe0);
  if (dst == (stb__leakcheck_malloc_info *)0x0) {
    sz_local = 0;
  }
  else {
    sx_strcpy((char *)dst,0x80,file);
    sx_strcpy(dst->func,0x40,func);
    sVar2 = mi_lock;
    LOCK();
    mi_lock = 1;
    UNLOCK();
    if (sVar2 != 0) {
      do {
      } while( true );
    }
    bVar1 = false;
    while (!bVar1) {
      dst->line = line;
      dst->next = mi_head;
      if (mi_head != (stb__leakcheck_malloc_info *)0x0) {
        dst->next->prev = dst;
      }
      dst->prev = (stb__leakcheck_malloc_info *)0x0;
      dst->size = (long)(int)sz;
      mi_lock = 0;
      mi_head = dst;
      bVar1 = true;
    }
    sz_local = (size_t)(dst + 1);
  }
  return (void *)sz_local;
}

Assistant:

static void* stb_leakcheck_malloc(size_t sz, const char* file, const char* func, int line)
{
    stb__leakcheck_malloc_info* mi = (stb__leakcheck_malloc_info*)malloc(sz + sizeof(*mi));
    if (mi == NULL)
        return mi;

    sx_strcpy(mi->file, sizeof(mi->file), file);
    sx_strcpy(mi->func, sizeof(mi->func), func);
    sx_lock(mi_lock) {
        mi->line = line;
        mi->next = mi_head;
        if (mi_head)
            mi->next->prev = mi;
        mi->prev = NULL;
        mi->size = (int)sz;
        mi_head = mi;
    }
    return mi + 1;
}